

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mobilitymodel.cpp
# Opt level: O1

void rev_calc(double longitude,double latitude,double height,double *res)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = sin(latitude);
  dVar3 = sin(latitude);
  dVar2 = dVar2 * -0.0066943799901413165 * dVar3 + 1.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar6 = 6378137.0 / dVar2 + height;
  dVar3 = cos(latitude);
  dVar4 = cos(longitude);
  dVar4 = dVar4 * dVar3 * dVar6;
  dVar3 = cos(latitude);
  dVar5 = sin(longitude);
  dVar5 = dVar5 * dVar3 * dVar6;
  dVar3 = sin(latitude);
  dVar3 = dVar3 * ((6378137.0 / dVar2) * 0.9933056200098587 + height);
  *res = dVar4;
  res[1] = dVar5;
  res[2] = dVar3;
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void rev_calc(double longitude, double latitude, double height, double* res){   //将经纬高（WGS84）转化为XYZ
    double _radiusEquator = 6378137;
    double _radiusPolar =  6356752.3142;
    double f = 1/298.257223563;
    double _eccentricitySquared = 2*f - pow(f,2);
    double N = _radiusEquator / sqrt( 1.0 - _eccentricitySquared*sin(latitude)*sin(latitude));
    double X = (N + height)*cos(latitude)*cos(longitude);
    double Y = (N + height)*cos(latitude)*sin(longitude);
    double Z = (N*(1.0-_eccentricitySquared) + height)*sin(latitude);
    res[0] = X;
    res[1] = Y;
    res[2] = Z;
    cout<<X<<"\t"<<Y<<"\t"<<Z<<endl;
}